

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_MetadataSet(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_MetaSet *this_00;
  string *extraout_RDX;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint uVar5;
  string *psVar6;
  allocator<char> local_d9;
  CX3DImporter_NodeElement *ne;
  string use;
  string def;
  string an;
  string reference;
  string name;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  uVar5 = 0;
  def.field_2._M_local_buf[0] = '\0';
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  reference._M_dataplus._M_p = (pointer)&reference.field_2;
  reference._M_string_length = 0;
  use.field_2._M_local_buf[0] = '\0';
  ne = (CX3DImporter_NodeElement *)0x0;
  name.field_2._M_local_buf[0] = '\0';
  reference.field_2._M_local_buf[0] = '\0';
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  do {
    if (uVar3 == uVar5) {
      if (use._M_string_length == 0) {
        this_00 = (CX3DImporter_NodeElement_MetaSet *)operator_new(0xa8);
        CX3DImporter_NodeElement_MetaSet::CX3DImporter_NodeElement_MetaSet
                  (this_00,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(this_00->super_CX3DImporter_NodeElement_Meta).super_CX3DImporter_NodeElement.
                      ID);
        }
        std::__cxx11::string::_M_assign((string *)ne[1].ID.field_2._M_local_buf);
        iVar4 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pParentElement = ne;
        if ((char)iVar4 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>((string *)&an,"MetadataSet",&local_d9);
          ParseNode_Metadata(this,pParentElement,extraout_RDX);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        this_01 = &this->NodeElement_List;
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,&use,ENET_MetaSet,&ne);
        if (!bVar2) {
          Throw_USE_NotFound(this,&use);
        }
        this_01 = &this->NodeElement_Cur->Child;
      }
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(this_01,&ne);
      std::__cxx11::string::~string((string *)&reference);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&use);
      std::__cxx11::string::~string((string *)&def);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)uVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),&local_d9);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)uVar5);
      psVar6 = &def;
LAB_00558209:
      std::__cxx11::string::assign((char *)psVar6);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)uVar5);
        psVar6 = &use;
        goto LAB_00558209;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"name");
            if (bVar2) {
              pFVar1 = (this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
              (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar1,(ulong)uVar5);
              psVar6 = &name;
            }
            else {
              bVar2 = std::operator==(&an,"reference");
              if (!bVar2) {
                Throw_IncorrectAttr(this,&an);
                goto LAB_00558211;
              }
              pFVar1 = (this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
              (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar1,(ulong)uVar5);
              psVar6 = &reference;
            }
            goto LAB_00558209;
          }
        }
      }
    }
LAB_00558211:
    std::__cxx11::string::~string((string *)&an);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_MetadataSet()
{
    std::string def, use;
    std::string name, reference;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_MetaSet, ne);
	}
	else
	{
		ne = new CX3DImporter_NodeElement_MetaSet(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_MetaSet*)ne)->Reference = reference;
		// also metadata node can contain childs
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "MetadataSet");
		else
			NodeElement_Cur->Child.push_back(ne);// made object as child to current element

		NodeElement_List.push_back(ne);// add new element to elements list.
	}// if(!use.empty()) else
}